

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O0

void __thiscall
TEST_TestHarness_c_count_mallocs_Test::~TEST_TestHarness_c_count_mallocs_Test
          (TEST_TestHarness_c_count_mallocs_Test *this)

{
  TEST_TestHarness_c_count_mallocs_Test *this_local;
  
  ~TEST_TestHarness_c_count_mallocs_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TestHarness_c, count_mallocs)
{
    cpputest_malloc_count_reset();
    void * m1 = cpputest_malloc(10);
    void * m2 = cpputest_malloc(11);
    void * m3 = cpputest_malloc(12);
    cpputest_free(m1);
    cpputest_free(m2);
    cpputest_free(m3);
    LONGS_EQUAL(3, cpputest_malloc_get_count());
}